

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[7],kj::_::TraceBuilder&>
          (String *__return_storage_ptr__,kj *this,char (*params) [7],TraceBuilder *params_1)

{
  char (*value) [7];
  TraceBuilder *this_00;
  TraceBuilder *value_00;
  String local_48;
  ArrayPtr<const_char> local_30;
  TraceBuilder *local_20;
  TraceBuilder *params_local_1;
  char (*params_local) [7];
  
  local_20 = (TraceBuilder *)params;
  params_local_1 = (TraceBuilder *)this;
  params_local = (char (*) [7])__return_storage_ptr__;
  value = ::const((char (*) [7])this);
  local_30 = toCharSequence<char_const(&)[7]>(value);
  this_00 = fwd<kj::_::TraceBuilder&>(local_20);
  toCharSequence<kj::_::TraceBuilder&>(&local_48,(kj *)this_00,value_00);
  _::concat<kj::ArrayPtr<char_const>,kj::String>
            (__return_storage_ptr__,(_ *)&local_30,(ArrayPtr<const_char> *)&local_48,
             (String *)params_1);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}